

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O1

int ImGuiStb::stb_textedit_paste
              (ImGuiTextEditState *str,STB_TexteditState *state,ImWchar *ctext,int len)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  ImWchar *pIVar4;
  
  stb_textedit_clamp(str,state);
  stb_textedit_delete_selection(str,state);
  bVar2 = STB_TEXTEDIT_INSERTCHARS(str,state->cursor,ctext,len);
  if (bVar2) {
    pIVar4 = stb_text_createundo(&state->undostate,state->cursor,0,len);
    uVar3 = (uint)pIVar4;
    state->cursor = state->cursor + len;
    state->has_preferred_x = '\0';
  }
  else {
    uVar1 = (state->undostate).undo_point;
    uVar3 = (uint)uVar1;
    if (uVar1 != 0) {
      uVar3 = uVar1 - 1;
      (state->undostate).undo_point = (short)uVar3;
    }
  }
  return uVar3;
}

Assistant:

static int stb_textedit_paste(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, STB_TEXTEDIT_CHARTYPE const *ctext, int len)
{
   STB_TEXTEDIT_CHARTYPE *text = (STB_TEXTEDIT_CHARTYPE *) ctext;
   // if there's a selection, the paste should delete it
   stb_textedit_clamp(str, state);
   stb_textedit_delete_selection(str,state);
   // try to insert the characters
   if (STB_TEXTEDIT_INSERTCHARS(str, state->cursor, text, len)) {
      stb_text_makeundo_insert(state, state->cursor, len);
      state->cursor += len;
      state->has_preferred_x = 0;
      return 1;
   }
   // remove the undo since we didn't actually insert the characters
   if (state->undostate.undo_point)
      --state->undostate.undo_point;
   return 0;
}